

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logfault.h
# Opt level: O2

void __thiscall logfault::Handler::PrintMessage(Handler *this,ostream *out,Message *msg)

{
  long lVar1;
  tm *ptVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  ostream *poVar4;
  string *psVar5;
  id __id;
  long lVar6;
  _Put_time<char> __f;
  _Put_time<char> __f_00;
  time_t tt;
  
  lVar1 = (msg->when_).__d.__r;
  tt = lVar1 / 1000000000;
  lVar6 = tt * 1000000000;
  if (SBORROW8(lVar1,lVar6) != lVar1 % 1000000000 < 0) {
    tt = tt + -1;
    lVar6 = lVar6 + -1000000000;
  }
  ptVar2 = localtime(&tt);
  if (ptVar2 == (tm *)0x0) {
    std::operator<<(out,"0000-00-00 00:00:00.000");
  }
  else {
    lVar1 = (msg->when_).__d.__r;
    __f._M_fmt = "%Y-%m-%d %H:%M:%S.";
    __f._M_tmb = (tm *)ptVar2;
    pbVar3 = std::operator<<(out,__f);
    *(undefined8 *)(pbVar3 + *(long *)(*(long *)pbVar3 + -0x18) + 0x10) = 3;
    poVar4 = std::operator<<(pbVar3,0x30);
    pbVar3 = (basic_ostream<char,_std::char_traits<char>_> *)
             std::ostream::operator<<((ostream *)poVar4,(int)((lVar1 - lVar6) / 1000000));
    __f_00._M_fmt = " %Z";
    __f_00._M_tmb = (tm *)ptVar2;
    std::operator<<(pbVar3,__f_00);
  }
  poVar4 = std::operator<<(out,' ');
  psVar5 = LevelName_abi_cxx11_(msg->level_);
  poVar4 = std::operator<<(poVar4,(string *)psVar5);
  poVar4 = std::operator<<(poVar4,' ');
  __id._M_thread = pthread_self();
  pbVar3 = std::operator<<(poVar4,__id);
  poVar4 = std::operator<<(pbVar3,' ');
  std::operator<<(poVar4,(string *)msg);
  return;
}

Assistant:

void PrintMessage(std::ostream& out, const logfault::Message& msg) {
            auto tt = std::chrono::system_clock::to_time_t(msg.when_);
            auto when_rounded = std::chrono::system_clock::from_time_t(tt);
            if (when_rounded > msg.when_) {
                --tt;
                when_rounded -= std::chrono::seconds(1);
            }
            if (const auto tm = (LOGFAULT_USE_UTCZONE ? std::gmtime(&tt) : std::localtime(&tt))) {
                const int ms = std::chrono::duration_cast<std::chrono::duration<int, std::milli>>(msg.when_ - when_rounded).count();

                out << std::put_time(tm, LOGFAULT_TIME_FORMAT)
#if LOGFAULT_TIME_PRINT_MILLISECONDS
                    << std::setw(3) << std::setfill('0') << ms
#endif
#if LOGFAULT_TIME_PRINT_TIMEZONE
#   if LOGFAULT_USE_UTCZONE
                    << " UTC";
#   else
                    << std::put_time(tm, " %Z")
#   endif
#endif
                    ;
            } else {
                out << "0000-00-00 00:00:00.000";
            }

            out << ' ' << LevelName(msg.level_)
                << ' ' << LOGFAULT_THREAD_NAME
                << ' ' << msg.msg_;
        }